

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonException.h
# Opt level: O2

void __thiscall Json::JsonException::error_info(JsonException *this,int size)

{
  int iVar1;
  ostream *poVar2;
  string *psVar3;
  char *pcVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string *local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string subErrorTextBackward;
  string subErrorTextForward;
  stringstream ss;
  ostream local_1a8 [8];
  string local_1a0 [368];
  
  iVar5 = (this->__reader).__ptr;
  iVar1 = (this->__reader).__len;
  JsonReader::substr_abi_cxx11_(&subErrorTextBackward,&this->__reader,size,true);
  JsonReader::substr_abi_cxx11_(&subErrorTextForward,&this->__reader,size,false);
  escape_rs(this,&subErrorTextForward);
  escape_rs(this,&subErrorTextBackward);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_1a8,"Error: JSON document parsing failed: [");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar5 + -1);
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,"] ");
  std::operator<<(poVar2,"\n");
  std::__cxx11::stringbuf::str();
  psVar3 = &this->__err;
  std::__cxx11::string::append((string *)psVar3);
  std::__cxx11::string::~string((string *)&local_240);
  iVar5 = (int)(stringstream *)&ss;
  std::ios::clear((int)*(undefined8 *)(_ss + -0x18) + iVar5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"",(allocator<char> *)&local_218);
  std::__cxx11::stringbuf::str(local_1a0);
  std::__cxx11::string::~string((string *)&local_240);
  poVar2 = std::operator<<(local_1a8,"==> ");
  poVar2 = std::operator<<(poVar2,"Error Text: [...");
  poVar2 = std::operator<<(poVar2,(string *)&subErrorTextBackward);
  poVar2 = std::operator<<(poVar2,(string *)&subErrorTextForward);
  std::operator<<(poVar2,"...]");
  std::__cxx11::stringbuf::str();
  std::operator+(&local_240,&local_218,"\n");
  std::__cxx11::string::append((string *)psVar3);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&local_240);
  std::ios::clear(iVar5 + (int)*(undefined8 *)(_ss + -0x18));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"",(allocator<char> *)&local_218);
  local_220 = (string *)psVar3;
  std::__cxx11::stringbuf::str(local_1a0);
  std::__cxx11::string::~string((string *)&local_240);
  iVar5 = 0;
  if ((int)local_240._M_string_length < 1) {
    local_240._M_string_length._0_4_ = 0;
  }
  for (; (int)local_240._M_string_length != iVar5; iVar5 = iVar5 + 1) {
    pcVar4 = "~";
    if ((int)subErrorTextBackward._M_string_length + 0x13 == iVar5) {
      pcVar4 = "^";
    }
    std::operator<<(local_1a8,pcVar4);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::append(local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::__cxx11::string::~string((string *)&subErrorTextForward);
  std::__cxx11::string::~string((string *)&subErrorTextBackward);
  return;
}

Assistant:

void error_info(int size = 10) const {
            int pos = __reader.pos() - 1;
            int len = __reader.length();
            std::string subErrorTextBackward = __reader.substr(size, true);
            std::string subErrorTextForward = __reader.substr(size);
            escape_rs(subErrorTextForward);
            escape_rs(subErrorTextBackward);
            std::stringstream ss;
            ss << "Error: JSON document parsing failed: [" << pos << "," << len << "] " << "\n";
            __err += ss.str();
            ss.clear(), ss.str("");
            ss << "==> " << "Error Text: [..."
               << subErrorTextBackward
               << subErrorTextForward << "...]";
            __err += ss.str() + "\n";
            int __ptr = subErrorTextBackward.size() + 19;
            int __len = ss.str().size();
            ss.clear(), ss.str("");
            for (int i = 0; i < __len; ++i) {
                if (i == __ptr)
                    ss << "^";
                else
                    ss << "~";
            }
            __err += ss.str();
        }